

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

bool __thiscall QBoxLayout::setStretchFactor(QBoxLayout *this,QLayout *layout,int stretch)

{
  long lVar1;
  undefined8 *puVar2;
  QLayout *pQVar3;
  ulong uVar4;
  
  lVar1 = *(long *)&(this->super_QLayout).field_0x8;
  if (*(long *)(lVar1 + 0xc0) != 0) {
    uVar4 = 0;
    do {
      puVar2 = *(undefined8 **)(*(long *)(lVar1 + 0xb8) + uVar4 * 8);
      pQVar3 = (QLayout *)(**(code **)(*(long *)*puVar2 + 0x70))();
      if (pQVar3 == layout) {
        if (*(int *)(puVar2 + 1) == stretch) {
          return true;
        }
        *(int *)(puVar2 + 1) = stretch;
        (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
        return true;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < *(ulong *)(lVar1 + 0xc0));
  }
  return false;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }